

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_object.cpp
# Opt level: O2

global_object_create_result *
mjs::make_array_object
          (global_object_create_result *__return_storage_ptr__,
          gc_heap_ptr<mjs::global_object> *global)

{
  gc_heap_ptr_untyped *pgVar1;
  uint32_t uVar2;
  long *plVar3;
  function_object *pfVar4;
  void *pvVar5;
  long *plVar6;
  gc_heap_ptr_untyped local_110;
  undefined1 local_100 [16];
  gc_heap_ptr_untyped local_f0;
  gc_heap_ptr_untyped local_e0;
  undefined1 local_d0 [40];
  string_view local_a8;
  value local_98;
  string_view local_70;
  gc_heap_ptr<mjs::array_object> prototype;
  gc_heap_ptr<mjs::function_object> c;
  string Array_str_;
  
  plVar3 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar3 + 0x98))(&Array_str_,plVar3,"Array");
  plVar3 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar3 + 0x58))(&local_98,plVar3);
  array_object::make((gc_heap_ptr<mjs::global_object> *)&prototype,(string *)global,
                     (object_ptr *)&Array_str_,(uint32_t)&local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_98);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)local_100,&global->super_gc_heap_ptr_untyped);
  make_raw_function((mjs *)&c,global);
  pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&c.super_gc_heap_ptr_untyped);
  local_d0._0_8_ = (gc_heap *)0x0;
  local_d0._8_4_ = 0;
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)&local_98,(size_t)(pfVar4->super_native_object).super_object.heap_);
  pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_98);
  *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001c7358;
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)((long)pvVar5 + 0x10),(gc_heap_ptr_untyped *)local_100);
  function_object::put_function
            (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&local_98,
             &Array_str_.super_gc_heap_ptr<mjs::gc_string>,(gc_heap_ptr<mjs::gc_string> *)local_d0,1
            );
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
  pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&c.super_gc_heap_ptr_untyped);
  function_object::default_construct_function(pfVar4);
  plVar3 = (long *)gc_heap_ptr_untyped::get(&prototype.super_gc_heap_ptr_untyped);
  plVar6 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar6 + 0x98))(local_d0,plVar6,"constructor");
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)local_100,&c.super_gc_heap_ptr_untyped);
  value::value(&local_98,(object_ptr *)local_100);
  (**(code **)(*plVar3 + 8))(plVar3,local_d0,&local_98,2);
  value::~value(&local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
  pvVar5 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  uVar2 = *(uint32_t *)((long)pvVar5 + 0x20);
  if ((int)uVar2 < 1) {
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_a8,&prototype.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)(local_d0 + 0x18),&global->super_gc_heap_ptr_untyped);
    local_70._M_len = 8;
    local_70._M_str = "toString";
    string::string((string *)(local_100 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_70)
    ;
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_a8);
    make_raw_function((mjs *)&local_110,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_100._0_8_ = (gc_heap *)0x0;
    local_100._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001c7398;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)((long)pvVar5 + 0x10),(gc_heap_ptr_untyped *)(local_d0 + 0x18)
              );
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)(local_100 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_100,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_e0,&local_110);
    value::value(&local_98,(object_ptr *)&local_e0);
    (**(code **)(*plVar3 + 8))(plVar3,local_100 + 0x10,&local_98,2);
  }
  else {
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)(local_d0 + 0x18),&prototype.super_gc_heap_ptr_untyped);
    pgVar1 = (gc_heap_ptr_untyped *)(local_d0 + 8);
    local_d0._0_4_ = uVar2;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(pgVar1,&global->super_gc_heap_ptr_untyped);
    local_a8._M_len = 8;
    local_a8._M_str = "toString";
    string::string((string *)&local_70,(global->super_gc_heap_ptr_untyped).heap_,&local_a8);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_d0 + 0x18));
    make_raw_function((mjs *)(local_100 + 0x10),global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_100 + 0x10));
    local_e0.heap_ = (gc_heap *)0x0;
    local_e0.pos_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_100,(size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_100);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001c73d8;
    *(undefined4 *)((long)pvVar5 + 0x10) = local_d0._0_4_;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)((long)pvVar5 + 0x18),pgVar1);
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_100,
               (gc_heap_ptr<mjs::gc_string> *)&local_70,(gc_heap_ptr<mjs::gc_string> *)&local_e0,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_110,(gc_heap_ptr_untyped *)(local_100 + 0x10));
    value::value(&local_98,(object_ptr *)&local_110);
    (**(code **)(*plVar3 + 8))(plVar3,&local_70,&local_98,2);
    value::~value(&local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_100 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_70);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(pgVar1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x18));
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)(local_d0 + 0x18),&prototype.super_gc_heap_ptr_untyped);
    pgVar1 = (gc_heap_ptr_untyped *)(local_d0 + 8);
    local_d0._0_4_ = uVar2;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(pgVar1,&global->super_gc_heap_ptr_untyped);
    local_a8._M_len = 0xe;
    local_a8._M_str = "toLocaleString";
    string::string((string *)&local_70,(global->super_gc_heap_ptr_untyped).heap_,&local_a8);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_d0 + 0x18));
    make_raw_function((mjs *)(local_100 + 0x10),global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_100 + 0x10));
    local_e0.heap_ = (gc_heap *)0x0;
    local_e0.pos_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_100,(size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_100);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001c7418;
    *(undefined4 *)((long)pvVar5 + 0x10) = local_d0._0_4_;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)((long)pvVar5 + 0x18),pgVar1);
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_100,
               (gc_heap_ptr<mjs::gc_string> *)&local_70,(gc_heap_ptr<mjs::gc_string> *)&local_e0,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_110,(gc_heap_ptr_untyped *)(local_100 + 0x10));
    value::value(&local_98,(object_ptr *)&local_110);
    (**(code **)(*plVar3 + 8))(plVar3,&local_70,&local_98,2);
    value::~value(&local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_100 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_70);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(pgVar1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x18));
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_a8,&prototype.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)(local_d0 + 0x18),&global->super_gc_heap_ptr_untyped);
    local_70._M_len = 6;
    local_70._M_str = "concat";
    string::string((string *)(local_100 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_70)
    ;
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_a8);
    make_raw_function((mjs *)&local_110,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_100._0_8_ = (gc_heap *)0x0;
    local_100._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001c7458;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)((long)pvVar5 + 0x10),(gc_heap_ptr_untyped *)(local_d0 + 0x18)
              );
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)(local_100 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_100,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_e0,&local_110);
    value::value(&local_98,(object_ptr *)&local_e0);
    (**(code **)(*plVar3 + 8))(plVar3,local_100 + 0x10,&local_98,2);
    value::~value(&local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_100 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x18));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_a8);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_a8,&prototype.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)(local_d0 + 0x18),&global->super_gc_heap_ptr_untyped);
    local_70._M_len = 3;
    local_70._M_str = "pop";
    string::string((string *)(local_100 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_70)
    ;
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_a8);
    make_raw_function((mjs *)&local_110,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_100._0_8_ = (gc_heap *)0x0;
    local_100._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001c7498;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)((long)pvVar5 + 0x10),(gc_heap_ptr_untyped *)(local_d0 + 0x18)
              );
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)(local_100 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_100,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_e0,&local_110);
    value::value(&local_98,(object_ptr *)&local_e0);
    (**(code **)(*plVar3 + 8))(plVar3,local_100 + 0x10,&local_98,2);
    value::~value(&local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_100 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x18));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_a8);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_a8,&prototype.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)(local_d0 + 0x18),&global->super_gc_heap_ptr_untyped);
    local_70._M_len = 4;
    local_70._M_str = "push";
    string::string((string *)(local_100 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_70)
    ;
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_a8);
    make_raw_function((mjs *)&local_110,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_100._0_8_ = (gc_heap *)0x0;
    local_100._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001c74d8;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)((long)pvVar5 + 0x10),(gc_heap_ptr_untyped *)(local_d0 + 0x18)
              );
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)(local_100 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_100,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_e0,&local_110);
    value::value(&local_98,(object_ptr *)&local_e0);
    (**(code **)(*plVar3 + 8))(plVar3,local_100 + 0x10,&local_98,2);
    value::~value(&local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_100 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x18));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_a8);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_a8,&prototype.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)(local_d0 + 0x18),&global->super_gc_heap_ptr_untyped);
    local_70._M_len = 5;
    local_70._M_str = "shift";
    string::string((string *)(local_100 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_70)
    ;
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_a8);
    make_raw_function((mjs *)&local_110,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_100._0_8_ = (gc_heap *)0x0;
    local_100._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001c7518;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)((long)pvVar5 + 0x10),(gc_heap_ptr_untyped *)(local_d0 + 0x18)
              );
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)(local_100 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_100,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_e0,&local_110);
    value::value(&local_98,(object_ptr *)&local_e0);
    (**(code **)(*plVar3 + 8))(plVar3,local_100 + 0x10,&local_98,2);
    value::~value(&local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_100 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x18));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_a8);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_a8,&prototype.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)(local_d0 + 0x18),&global->super_gc_heap_ptr_untyped);
    local_70._M_len = 7;
    local_70._M_str = "unshift";
    string::string((string *)(local_100 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_70)
    ;
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_a8);
    make_raw_function((mjs *)&local_110,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_100._0_8_ = (gc_heap *)0x0;
    local_100._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001c7558;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)((long)pvVar5 + 0x10),(gc_heap_ptr_untyped *)(local_d0 + 0x18)
              );
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)(local_100 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_100,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_e0,&local_110);
    value::value(&local_98,(object_ptr *)&local_e0);
    (**(code **)(*plVar3 + 8))(plVar3,local_100 + 0x10,&local_98,2);
    value::~value(&local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_100 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x18));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_a8);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_a8,&prototype.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)(local_d0 + 0x18),&global->super_gc_heap_ptr_untyped);
    local_70._M_len = 5;
    local_70._M_str = "slice";
    string::string((string *)(local_100 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_70)
    ;
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_a8);
    make_raw_function((mjs *)&local_110,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_100._0_8_ = (gc_heap *)0x0;
    local_100._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001c7598;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)((long)pvVar5 + 0x10),(gc_heap_ptr_untyped *)(local_d0 + 0x18)
              );
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)(local_100 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_100,2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_e0,&local_110);
    value::value(&local_98,(object_ptr *)&local_e0);
    (**(code **)(*plVar3 + 8))(plVar3,local_100 + 0x10,&local_98,2);
    value::~value(&local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_100 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x18));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_a8);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_a8,&prototype.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)(local_d0 + 0x18),&global->super_gc_heap_ptr_untyped);
    local_70._M_len = 6;
    local_70._M_str = "splice";
    string::string((string *)(local_100 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_70)
    ;
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_a8);
    make_raw_function((mjs *)&local_110,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_100._0_8_ = (gc_heap *)0x0;
    local_100._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001c75d8;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)((long)pvVar5 + 0x10),(gc_heap_ptr_untyped *)(local_d0 + 0x18)
              );
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)(local_100 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_100,2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_e0,&local_110);
    value::value(&local_98,(object_ptr *)&local_e0);
    (**(code **)(*plVar3 + 8))(plVar3,local_100 + 0x10,&local_98,2);
  }
  value::~value(&local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_100 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x18));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_a8);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)&local_a8,&prototype.super_gc_heap_ptr_untyped);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)(local_d0 + 0x18),&global->super_gc_heap_ptr_untyped);
  local_70._M_len = 4;
  local_70._M_str = "join";
  string::string((string *)(local_100 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_70);
  plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_a8);
  make_raw_function((mjs *)&local_110,global);
  pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
  local_100._0_8_ = (gc_heap *)0x0;
  local_100._8_4_ = 0;
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)local_d0,(size_t)(pfVar4->super_native_object).super_object.heap_);
  pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
  *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001c7618;
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)((long)pvVar5 + 0x10),(gc_heap_ptr_untyped *)(local_d0 + 0x18));
  function_object::put_function
            (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_d0,
             (gc_heap_ptr<mjs::gc_string> *)(local_100 + 0x10),
             (gc_heap_ptr<mjs::gc_string> *)local_100,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_e0,&local_110);
  value::value(&local_98,(object_ptr *)&local_e0);
  (**(code **)(*plVar3 + 8))(plVar3,local_100 + 0x10,&local_98,2);
  value::~value(&local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_100 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x18));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_a8);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)&local_a8,&prototype.super_gc_heap_ptr_untyped);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)(local_d0 + 0x18),&global->super_gc_heap_ptr_untyped);
  local_70._M_len = 7;
  local_70._M_str = "reverse";
  string::string((string *)(local_100 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_70);
  plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_a8);
  make_raw_function((mjs *)&local_110,global);
  pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
  local_100._0_8_ = (gc_heap *)0x0;
  local_100._8_4_ = 0;
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)local_d0,(size_t)(pfVar4->super_native_object).super_object.heap_);
  pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
  *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001c7658;
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)((long)pvVar5 + 0x10),(gc_heap_ptr_untyped *)(local_d0 + 0x18));
  function_object::put_function
            (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_d0,
             (gc_heap_ptr<mjs::gc_string> *)(local_100 + 0x10),
             (gc_heap_ptr<mjs::gc_string> *)local_100,0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_e0,&local_110);
  value::value(&local_98,(object_ptr *)&local_e0);
  (**(code **)(*plVar3 + 8))(plVar3,local_100 + 0x10,&local_98,2);
  value::~value(&local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_100 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x18));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_a8);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)&local_a8,&prototype.super_gc_heap_ptr_untyped);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)(local_d0 + 0x18),&global->super_gc_heap_ptr_untyped);
  local_70._M_len = 4;
  local_70._M_str = "sort";
  string::string((string *)(local_100 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_70);
  plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_a8);
  make_raw_function((mjs *)&local_110,global);
  pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
  local_100._0_8_ = (gc_heap *)0x0;
  local_100._8_4_ = 0;
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)local_d0,(size_t)(pfVar4->super_native_object).super_object.heap_);
  pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
  *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001c7698;
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)((long)pvVar5 + 0x10),(gc_heap_ptr_untyped *)(local_d0 + 0x18));
  function_object::put_function
            (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_d0,
             (gc_heap_ptr<mjs::gc_string> *)(local_100 + 0x10),
             (gc_heap_ptr<mjs::gc_string> *)local_100,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_e0,&local_110);
  value::value(&local_98,(object_ptr *)&local_e0);
  (**(code **)(*plVar3 + 8))(plVar3,local_100 + 0x10,&local_98,2);
  value::~value(&local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_100 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x18));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_a8);
  if (1 < (int)uVar2) {
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_a8,&prototype.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)(local_d0 + 0x18),&global->super_gc_heap_ptr_untyped);
    local_70._M_len = 7;
    local_70._M_str = "indexOf";
    string::string((string *)(local_100 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_70)
    ;
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_a8);
    make_raw_function((mjs *)&local_110,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_100._0_8_ = (gc_heap *)0x0;
    local_100._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001c76d8;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)((long)pvVar5 + 0x10),(gc_heap_ptr_untyped *)(local_d0 + 0x18)
              );
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)(local_100 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_100,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_e0,&local_110);
    value::value(&local_98,(object_ptr *)&local_e0);
    (**(code **)(*plVar3 + 8))(plVar3,local_100 + 0x10,&local_98,2);
    value::~value(&local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_100 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x18));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_a8);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_a8,&prototype.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)(local_d0 + 0x18),&global->super_gc_heap_ptr_untyped);
    local_70._M_len = 0xb;
    local_70._M_str = "lastIndexOf";
    string::string((string *)(local_100 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_70)
    ;
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_a8);
    make_raw_function((mjs *)&local_110,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_100._0_8_ = (gc_heap *)0x0;
    local_100._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001c7718;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)((long)pvVar5 + 0x10),(gc_heap_ptr_untyped *)(local_d0 + 0x18)
              );
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)(local_100 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_100,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_e0,&local_110);
    value::value(&local_98,(object_ptr *)&local_e0);
    (**(code **)(*plVar3 + 8))(plVar3,local_100 + 0x10,&local_98,2);
    value::~value(&local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_100 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x18));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_a8);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_a8,&prototype.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)(local_d0 + 0x18),&global->super_gc_heap_ptr_untyped);
    local_70._M_len = 5;
    local_70._M_str = "every";
    string::string((string *)(local_100 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_70)
    ;
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_a8);
    make_raw_function((mjs *)&local_110,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_100._0_8_ = (gc_heap *)0x0;
    local_100._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001c7758;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)((long)pvVar5 + 0x10),(gc_heap_ptr_untyped *)(local_d0 + 0x18)
              );
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)(local_100 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_100,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_e0,&local_110);
    value::value(&local_98,(object_ptr *)&local_e0);
    (**(code **)(*plVar3 + 8))(plVar3,local_100 + 0x10,&local_98,2);
    value::~value(&local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_100 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x18));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_a8);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_a8,&prototype.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)(local_d0 + 0x18),&global->super_gc_heap_ptr_untyped);
    local_70._M_len = 4;
    local_70._M_str = "some";
    string::string((string *)(local_100 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_70)
    ;
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_a8);
    make_raw_function((mjs *)&local_110,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_100._0_8_ = (gc_heap *)0x0;
    local_100._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001c7798;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)((long)pvVar5 + 0x10),(gc_heap_ptr_untyped *)(local_d0 + 0x18)
              );
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)(local_100 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_100,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_e0,&local_110);
    value::value(&local_98,(object_ptr *)&local_e0);
    (**(code **)(*plVar3 + 8))(plVar3,local_100 + 0x10,&local_98,2);
    value::~value(&local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_100 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x18));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_a8);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_a8,&prototype.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)(local_d0 + 0x18),&global->super_gc_heap_ptr_untyped);
    local_70._M_len = 7;
    local_70._M_str = "forEach";
    string::string((string *)(local_100 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_70)
    ;
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_a8);
    make_raw_function((mjs *)&local_110,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_100._0_8_ = (gc_heap *)0x0;
    local_100._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001c77d8;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)((long)pvVar5 + 0x10),(gc_heap_ptr_untyped *)(local_d0 + 0x18)
              );
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)(local_100 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_100,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_e0,&local_110);
    value::value(&local_98,(object_ptr *)&local_e0);
    (**(code **)(*plVar3 + 8))(plVar3,local_100 + 0x10,&local_98,2);
    value::~value(&local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_100 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x18));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_a8);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_a8,&prototype.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)(local_d0 + 0x18),&global->super_gc_heap_ptr_untyped);
    local_70._M_len = 3;
    local_70._M_str = "map";
    string::string((string *)(local_100 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_70)
    ;
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_a8);
    make_raw_function((mjs *)&local_110,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_100._0_8_ = (gc_heap *)0x0;
    local_100._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001c7818;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)((long)pvVar5 + 0x10),(gc_heap_ptr_untyped *)(local_d0 + 0x18)
              );
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)(local_100 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_100,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_e0,&local_110);
    value::value(&local_98,(object_ptr *)&local_e0);
    (**(code **)(*plVar3 + 8))(plVar3,local_100 + 0x10,&local_98,2);
    value::~value(&local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_100 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x18));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_a8);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_a8,&prototype.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)(local_d0 + 0x18),&global->super_gc_heap_ptr_untyped);
    local_70._M_len = 6;
    local_70._M_str = "filter";
    string::string((string *)(local_100 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_70)
    ;
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_a8);
    make_raw_function((mjs *)&local_110,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_100._0_8_ = (gc_heap *)0x0;
    local_100._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001c7858;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)((long)pvVar5 + 0x10),(gc_heap_ptr_untyped *)(local_d0 + 0x18)
              );
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)(local_100 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_100,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_e0,&local_110);
    value::value(&local_98,(object_ptr *)&local_e0);
    (**(code **)(*plVar3 + 8))(plVar3,local_100 + 0x10,&local_98,2);
    value::~value(&local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_100 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x18));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_a8);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_a8,&prototype.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)(local_d0 + 0x18),&global->super_gc_heap_ptr_untyped);
    local_70._M_len = 6;
    local_70._M_str = "reduce";
    string::string((string *)(local_100 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_70)
    ;
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_a8);
    make_raw_function((mjs *)&local_110,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_100._0_8_ = (gc_heap *)0x0;
    local_100._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001c7898;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)((long)pvVar5 + 0x10),(gc_heap_ptr_untyped *)(local_d0 + 0x18)
              );
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)(local_100 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_100,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_e0,&local_110);
    value::value(&local_98,(object_ptr *)&local_e0);
    (**(code **)(*plVar3 + 8))(plVar3,local_100 + 0x10,&local_98,2);
    value::~value(&local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_100 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x18));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_a8);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_a8,&prototype.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)(local_d0 + 0x18),&global->super_gc_heap_ptr_untyped);
    local_70._M_len = 0xb;
    local_70._M_str = "reduceRight";
    string::string((string *)(local_100 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_70)
    ;
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_a8);
    make_raw_function((mjs *)&local_110,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_100._0_8_ = (gc_heap *)0x0;
    local_100._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001c78d8;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)((long)pvVar5 + 0x10),(gc_heap_ptr_untyped *)(local_d0 + 0x18)
              );
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)(local_100 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_100,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_e0,&local_110);
    value::value(&local_98,(object_ptr *)&local_e0);
    (**(code **)(*plVar3 + 8))(plVar3,local_100 + 0x10,&local_98,2);
    value::~value(&local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_100 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x18));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_a8);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_a8,&c.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)(local_d0 + 0x18),&global->super_gc_heap_ptr_untyped);
    local_70._M_len = 7;
    local_70._M_str = "isArray";
    string::string((string *)(local_100 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_70)
    ;
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_a8);
    make_raw_function((mjs *)&local_110,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_100._0_8_ = (gc_heap *)0x0;
    local_100._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001c7918;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)((long)pvVar5 + 0x10),(gc_heap_ptr_untyped *)(local_d0 + 0x18)
              );
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)(local_100 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_100,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_e0,&local_110);
    value::value(&local_98,(object_ptr *)&local_e0);
    (**(code **)(*plVar3 + 8))(plVar3,local_100 + 0x10,&local_98,2);
    value::~value(&local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_100 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x18));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_a8);
  }
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)__return_storage_ptr__,&c.super_gc_heap_ptr_untyped);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            (&(__return_storage_ptr__->prototype).super_gc_heap_ptr_untyped,
             &prototype.super_gc_heap_ptr_untyped);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&c.super_gc_heap_ptr_untyped);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&prototype.super_gc_heap_ptr_untyped);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&Array_str_);
  return __return_storage_ptr__;
}

Assistant:

global_object_create_result make_array_object(const gc_heap_ptr<global_object>& global) {
    auto Array_str_ = global->common_string("Array");
    auto prototype = array_object::make(global, Array_str_, global->object_prototype(), 0);

    auto c = make_function(global, [global](const value&, const std::vector<value>& args) {
        return value{make_array(global, args)};
    }, Array_str_.unsafe_raw_get(), 1);
    c->default_construct_function();

    prototype->put(global->common_string("constructor"), value{c}, global_object::default_attributes);

    const auto version = global->language_version();

    if (version < version::es3) {
        put_native_function(global, prototype, "toString", [global = global](const value& this_, const std::vector<value>&) {
            global->validate_object(this_);
            return value{array_join(this_.object_value(), L",")};
        }, 0);
    } else {
        put_native_function(global, prototype, "toString", [version, global = global](const value& this_, const std::vector<value>&) {
            if (version < version::es5) global->validate_type(this_, global->array_prototype(), "array");
            return value{array_join(this_.object_value(), L",")};
        }, 0);
        put_native_function(global, prototype, "toLocaleString", [version, global = global](const value& this_, const std::vector<value>&) {
            if (version < version::es5) global->validate_type(this_, global->array_prototype(), "array");
            return value{array_to_locale_string(global, this_.object_value())};
        }, 0);
        put_native_function(global, prototype, "concat", [global](const value& this_, const std::vector<value>& args) {
            return array_concat(global, this_, args);
        }, 1);
        put_native_function(global, prototype, "pop", [global](const value& this_, const std::vector<value>&) {
            global->validate_object(this_);
            return array_pop(global, this_.object_value());
        }, 0);
        put_native_function(global, prototype, "push", [global](const value& this_, const std::vector<value>& args) {
            global->validate_object(this_);
            return array_push(global, this_.object_value(), args);
        }, 1);
        put_native_function(global, prototype, "shift", [global](const value& this_, const std::vector<value>&) {
            global->validate_object(this_);
            return array_shift(global, this_.object_value());
        }, 0);
        put_native_function(global, prototype, "unshift", [global](const value& this_, const std::vector<value>& args) {
            global->validate_object(this_);
            return array_unshift(global, this_.object_value(), args);
        }, 1);
        put_native_function(global, prototype, "slice", [global](const value& this_, const std::vector<value>& args) {
            global->validate_object(this_);
            return array_slice(global, this_.object_value(), args);
        }, 2);
        put_native_function(global, prototype, "splice", [global](const value& this_, const std::vector<value>& args) {
            global->validate_object(this_);
            return array_splice(global, this_.object_value(), args);
        }, 2);
    }
    put_native_function(global, prototype, "join", [global](const value& this_, const std::vector<value>& args) {
        global->validate_object(this_);
        auto& h = global.heap();
        return value{array_join(this_.object_value(), !args.empty() ? to_string(h, args.front()).view() : std::wstring_view{L","})};
    }, 1);
    put_native_function(global, prototype, "reverse", [global](const value& this_, const std::vector<value>&) {
        global->validate_object(this_);
        const auto& o = this_.object_value();
        const uint32_t length = to_uint32(o->get(L"length"));
        auto& h = global.heap();
        for (uint32_t k = 0; k != length / 2; ++k) {
            const auto i1 = index_string(k);
            const auto i2 = index_string(length - k - 1);
            auto v1 = o->get(i1);
            auto v2 = o->get(i2);
            o->put(string{h, i1}, v2);
            o->put(string{h, i2}, v1);
        }
        return this_;
    }, 0);
    put_native_function(global, prototype, "sort", [global](const value& this_, const std::vector<value>& args) {
        global->validate_object(this_);
        const auto& o = *this_.object_value();
        auto& h = o.heap(); // Capture heap reference (which continues to be valid even after GC) since `this` can move when calling a user-defined compare function (since this can cause GC)
        const uint32_t length = to_uint32(o.get(L"length"));

        value comparefn = !args.empty() ? args.front() : value::undefined;

        auto sort_compare = [comparefn, &h](const value& x, const value& y) {
            if (x.type() == value_type::undefined && y.type() == value_type::undefined) {
                return 0;
            } else if (x.type() == value_type::undefined) {
                return 1;
            } else if (y.type() == value_type::undefined) {
                return -1;
            }
            if (comparefn.type() != value_type::undefined) {
                const auto r = to_number(call_function(comparefn, value::null, {x,y}));
                if (r < 0) return -1;
                if (r > 0) return 1;
                return 0;
            } else {
                const auto xs = to_string(h, x);
                const auto ys = to_string(h, y);
                if (xs.view() < ys.view()) return -1;
                if (xs.view() > ys.view()) return 1;
                return 0;
            }
        };

        std::vector<value> values(length);
        for (uint32_t i = 0; i < length; ++i) {
            values[i] = o.get(index_string(i));
        }
        std::stable_sort(values.begin(), values.end(), [&](const value& x, const value& y) {
            return sort_compare(x, y) < 0;
        });
        // Note: `this` has possibly become invalid here (!)
        auto& o_after = *this_.object_value(); // Recapture object reference (since it could also have moved)
        for (uint32_t i = 0; i < length; ++i) {
            o_after.put(string{h, index_string(i)}, values[i]);
        }
        return this_;
    }, 1);


    if (version >= version::es5) {
        put_native_function(global, prototype, "indexOf", [global](const value& this_, const std::vector<value>& args) {
            return value{array_index_of(global, this_, args)};
        }, 1);

        put_native_function(global, prototype, "lastIndexOf", [global](const value& this_, const std::vector<value>& args) {
            return value{array_last_index_of(global, this_, args)};
        }, 1);

        put_native_function(global, prototype, "every", [global](const value& this_, const std::vector<value>& args) {
            return value{array_every(global, this_, args)};
        }, 1);

        put_native_function(global, prototype, "some", [global](const value& this_, const std::vector<value>& args) {
            return value{array_some(global, this_, args)};
        }, 1);

        put_native_function(global, prototype, "forEach", [global](const value& this_, const std::vector<value>& args) {
            array_for_each(global, this_, args);
            return value::undefined;
        }, 1);

        put_native_function(global, prototype, "map", [global](const value& this_, const std::vector<value>& args) {
            return value{array_map(global, this_, args)};
        }, 1);

        put_native_function(global, prototype, "filter", [global](const value& this_, const std::vector<value>& args) {
            return value{array_filter(global, this_, args)};
        }, 1);

        put_native_function(global, prototype, "reduce", [global](const value& this_, const std::vector<value>& args) {
            return value{array_reduce(global, this_, args, false)};
        }, 1);

        put_native_function(global, prototype, "reduceRight", [global](const value& this_, const std::vector<value>& args) {
            return value{array_reduce(global, this_, args, true)};
        }, 1);

        put_native_function(global, c, "isArray", [global](const value&, const std::vector<value>& args) {
            return value{!args.empty() && args.front().type() == value_type::object && is_array(args.front().object_value())};
        }, 1);
    }

    return { c, prototype };
}